

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeysTool.cpp
# Opt level: O2

void createToken(path *keyFile)

{
  ostream *poVar1;
  pointer_const_type this;
  runtime_error *prVar2;
  PublicKey *in_RCX;
  ulong uVar3;
  string tokenStr;
  optional<jbcoin::ValidatorToken> token;
  string local_a8 [32];
  ValidatorKeys keys;
  
  jbcoin::ValidatorKeys::make_ValidatorKeys(&keys,keyFile);
  if (keys.revoked_ == true) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Validator keys have been revoked.");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tokenStr._M_dataplus._M_p._0_4_ = 0;
  jbcoin::ValidatorKeys::createValidatorToken(&token,&keys,(KeyType *)&tokenStr);
  if (token.super_type.m_initialized != false) {
    jbcoin::ValidatorKeys::writeToFile(&keys,keyFile);
    std::operator<<((ostream *)&std::cout,
                    "Update jbcoind.cfg file with these values and restart jbcoind:\n\n");
    poVar1 = std::operator<<((ostream *)&std::cout,"# validator public key: ");
    jbcoin::toBase58_abi_cxx11_((string *)&tokenStr,(jbcoin *)0x1c,(int)&keys + 8,in_RCX);
    poVar1 = std::operator<<(poVar1,(string *)&tokenStr);
    std::operator<<(poVar1,"\n\n");
    std::__cxx11::string::~string((string *)&tokenStr);
    std::operator<<((ostream *)&std::cout,"[validator_token]\n");
    this = boost::optional<jbcoin::ValidatorToken>::operator->(&token);
    jbcoin::ValidatorToken::toString_abi_cxx11_((string *)&tokenStr,this);
    for (uVar3 = 0; uVar3 < tokenStr._M_string_length; uVar3 = uVar3 + 0x48) {
      std::__cxx11::string::substr((ulong)local_a8,(ulong)&tokenStr);
      poVar1 = std::operator<<((ostream *)&std::cout,local_a8);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string(local_a8);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__cxx11::string::~string((string *)&tokenStr);
    boost::optional_detail::optional_base<jbcoin::ValidatorToken>::~optional_base(&token.super_type)
    ;
    jbcoin::SecretKey::~SecretKey(&keys.secretKey_);
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (prVar2,
             "Maximum number of tokens have already been generated.\nRevoke validator keys if previous token has been compromised."
            );
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void createToken (boost::filesystem::path const& keyFile)
{
    using namespace jbcoin;

    auto keys = ValidatorKeys::make_ValidatorKeys (keyFile);

    if (keys.revoked ())
        throw std::runtime_error (
            "Validator keys have been revoked.");

    auto const token = keys.createValidatorToken ();

    if (! token)
        throw std::runtime_error (
            "Maximum number of tokens have already been generated.\n"
            "Revoke validator keys if previous token has been compromised.");

    // Update key file with new token sequence
    keys.writeToFile (keyFile);

    std::cout << "Update jbcoind.cfg file with these values and restart jbcoind:\n\n";
    std::cout << "# validator public key: " <<
        toBase58 (TOKEN_NODE_PUBLIC, keys.publicKey()) << "\n\n";
    std::cout << "[validator_token]\n";

    auto const tokenStr = token->toString();
    auto const len = 72;
    for (auto i = 0; i < tokenStr.size(); i += len)
        std::cout << tokenStr.substr(i, len) << std::endl;

    std::cout << std::endl;
}